

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void zng_tr_init(deflate_state *s)

{
  deflate_state *in_RDI;
  
  (in_RDI->l_desc).dyn_tree = in_RDI->dyn_ltree;
  (in_RDI->l_desc).stat_desc = &static_l_desc;
  (in_RDI->d_desc).dyn_tree = in_RDI->dyn_dtree;
  (in_RDI->d_desc).stat_desc = &static_d_desc;
  (in_RDI->bl_desc).dyn_tree = in_RDI->bl_tree;
  (in_RDI->bl_desc).stat_desc = &static_bl_desc;
  in_RDI->bi_buf = 0;
  in_RDI->bi_valid = 0;
  init_block(in_RDI);
  return;
}

Assistant:

void Z_INTERNAL zng_tr_init(deflate_state *s) {
    s->l_desc.dyn_tree = s->dyn_ltree;
    s->l_desc.stat_desc = &static_l_desc;

    s->d_desc.dyn_tree = s->dyn_dtree;
    s->d_desc.stat_desc = &static_d_desc;

    s->bl_desc.dyn_tree = s->bl_tree;
    s->bl_desc.stat_desc = &static_bl_desc;

    s->bi_buf = 0;
    s->bi_valid = 0;
#ifdef ZLIB_DEBUG
    s->compressed_len = 0L;
    s->bits_sent = 0L;
#endif

    /* Initialize the first block of the first file: */
    init_block(s);
}